

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmpar.c
# Opt level: O0

int lmpar_cvkit(integer *n,doublereal *r__,integer *ldr,integer *ipvt,doublereal *diag,
               doublereal *qtb,doublereal *delta,doublereal *par,doublereal *x,doublereal *sdiag,
               doublereal *wa1,doublereal *wa2)

{
  double dVar1;
  long lVar2;
  doublereal *pdVar3;
  long lVar4;
  long lVar5;
  doublereal *wa;
  long lVar6;
  long lVar7;
  doublereal *x_00;
  long lVar8;
  long lVar9;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  doublereal *pdVar10;
  integer *n_00;
  doublereal dVar11;
  double dVar12;
  double *in_stack_00000008;
  double *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  doublereal sum;
  integer jp1;
  integer jm1;
  doublereal dxnorm;
  doublereal fp;
  doublereal gnorm;
  integer nsing;
  doublereal dwarf;
  integer l;
  integer k;
  integer j;
  integer i__;
  doublereal paru;
  doublereal temp;
  integer iter;
  doublereal parl;
  doublereal parc;
  doublereal d__2;
  doublereal d__1;
  integer i__2;
  integer i__1;
  integer r_offset;
  integer r_dim1;
  doublereal *local_130;
  double local_128;
  double local_118;
  doublereal *local_110;
  double local_108;
  doublereal *local_100;
  doublereal local_f8;
  doublereal local_e8;
  doublereal *in_stack_ffffffffffffff28;
  integer *in_stack_ffffffffffffff30;
  double local_c8;
  long local_b8;
  long local_a0;
  doublereal *local_98;
  long local_90;
  double local_88;
  doublereal *qtb_00;
  doublereal *diag_00;
  integer *in_stack_ffffffffffffff98;
  doublereal *in_stack_ffffffffffffffa0;
  doublereal *in_stack_ffffffffffffffa8;
  doublereal *in_stack_ffffffffffffffb0;
  doublereal *sdiag_00;
  
  in_stack_00000030 = in_stack_00000030 + -8;
  lVar4 = in_stack_00000028 + -8;
  lVar5 = in_stack_00000018 + -8;
  wa = (doublereal *)(in_R9 + -8);
  lVar6 = in_R8 + -8;
  lVar7 = in_RCX + -8;
  sdiag_00 = (doublereal *)*in_RDX;
  x_00 = (doublereal *)((long)sdiag_00 + 1);
  lVar8 = in_RSI + (long)x_00 * -8;
  pdVar10 = (doublereal *)dpmpar_cvkit(&c__2);
  local_b8 = *in_RDI;
  lVar9 = *in_RDI;
  for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
      local_98 = (doublereal *)((long)local_98 + 1)) {
    *(doublereal *)(lVar4 + (long)local_98 * 8) = wa[(long)local_98];
    dVar12 = *(double *)(lVar8 + ((long)local_98 + (long)local_98 * (long)sdiag_00) * 8);
    if (((dVar12 == lmpar_cvkit::zero) && (!NAN(dVar12) && !NAN(lmpar_cvkit::zero))) &&
       (local_b8 == *in_RDI)) {
      local_b8 = (long)local_98 + -1;
    }
    if (local_b8 < *in_RDI) {
      *(doublereal *)(lVar4 + (long)local_98 * 8) = lmpar_cvkit::zero;
    }
  }
  if (0 < local_b8) {
    for (local_a0 = 1; local_a0 <= local_b8; local_a0 = local_a0 + 1) {
      in_stack_ffffffffffffff28 = (doublereal *)(local_b8 - local_a0);
      lVar9 = (long)in_stack_ffffffffffffff28 + 1;
      *(double *)(lVar4 + lVar9 * 8) =
           *(double *)(lVar4 + lVar9 * 8) /
           *(double *)(lVar8 + (lVar9 + lVar9 * (long)sdiag_00) * 8);
      dVar12 = *(double *)(lVar4 + lVar9 * 8);
      if (0 < (long)in_stack_ffffffffffffff28) {
        for (local_90 = 1; in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff28,
            local_90 <= (long)in_stack_ffffffffffffff28; local_90 = local_90 + 1) {
          *(double *)(lVar4 + local_90 * 8) =
               -*(double *)(lVar8 + (local_90 + lVar9 * (long)sdiag_00) * 8) * dVar12 +
               *(double *)(lVar4 + local_90 * 8);
        }
      }
    }
  }
  lVar9 = *in_RDI;
  for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
      local_98 = (doublereal *)((long)local_98 + 1)) {
    *(undefined8 *)(lVar5 + *(long *)(lVar7 + (long)local_98 * 8) * 8) =
         *(undefined8 *)(lVar4 + (long)local_98 * 8);
  }
  qtb_00 = (doublereal *)0x0;
  lVar9 = *in_RDI;
  for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
      local_98 = (doublereal *)((long)local_98 + 1)) {
    *(double *)(in_stack_00000030 + (long)local_98 * 8) =
         *(double *)(lVar6 + (long)local_98 * 8) * *(double *)(lVar5 + (long)local_98 * 8);
  }
  n_00 = (integer *)enorm_cvkit(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_c8 = (double)n_00 - *in_stack_00000008;
  if (lmpar_cvkit::p1 * *in_stack_00000008 < local_c8) {
    diag_00 = (doublereal *)lmpar_cvkit::zero;
    if (*in_RDI <= local_b8) {
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        lVar2 = *(long *)(lVar7 + (long)local_98 * 8);
        *(double *)(lVar4 + (long)local_98 * 8) =
             *(double *)(lVar6 + lVar2 * 8) *
             (*(double *)(in_stack_00000030 + lVar2 * 8) / (double)n_00);
      }
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        local_e8 = lmpar_cvkit::zero;
        in_stack_ffffffffffffff28 = (doublereal *)((long)local_98 + -1);
        if (0 < (long)in_stack_ffffffffffffff28) {
          for (local_90 = 1; in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff28,
              local_90 <= (long)in_stack_ffffffffffffff28; local_90 = local_90 + 1) {
            local_e8 = *(double *)(lVar8 + (local_90 + (long)local_98 * (long)sdiag_00) * 8) *
                       *(double *)(lVar4 + local_90 * 8) + local_e8;
          }
        }
        *(double *)(lVar4 + (long)local_98 * 8) =
             (*(double *)(lVar4 + (long)local_98 * 8) - local_e8) /
             *(double *)(lVar8 + ((long)local_98 + (long)local_98 * (long)sdiag_00) * 8);
      }
      dVar11 = enorm_cvkit(n_00,in_stack_ffffffffffffff28);
      diag_00 = (doublereal *)(((local_c8 / *in_stack_00000008) / dVar11) / dVar11);
    }
    lVar9 = *in_RDI;
    local_98 = (doublereal *)0x1;
    pdVar3 = local_98;
    while (local_98 = pdVar3, (long)local_98 <= lVar9) {
      local_e8 = lmpar_cvkit::zero;
      for (local_90 = 1; local_90 <= (long)local_98; local_90 = local_90 + 1) {
        local_e8 = *(double *)(lVar8 + (local_90 + (long)local_98 * (long)sdiag_00) * 8) *
                   wa[local_90] + local_e8;
      }
      *(double *)(lVar4 + (long)local_98 * 8) =
           local_e8 / *(double *)(lVar6 + *(long *)(lVar7 + (long)local_98 * 8) * 8);
      in_stack_ffffffffffffffb0 = local_98;
      pdVar3 = (doublereal *)((long)local_98 + 1);
    }
    dVar11 = enorm_cvkit(n_00,in_stack_ffffffffffffff28);
    local_88 = dVar11 / *in_stack_00000008;
    if ((local_88 == lmpar_cvkit::zero) && (!NAN(local_88) && !NAN(lmpar_cvkit::zero))) {
      if (lmpar_cvkit::p1 < *in_stack_00000008) {
        local_f8 = lmpar_cvkit::p1;
      }
      else {
        local_f8 = *in_stack_00000008;
      }
      local_88 = (double)pdVar10 / local_f8;
    }
    local_100 = diag_00;
    if ((double)diag_00 <= *in_stack_00000010) {
      local_100 = (doublereal *)*in_stack_00000010;
    }
    *in_stack_00000010 = (double)local_100;
    if (local_88 < *in_stack_00000010) {
      local_108 = local_88;
    }
    else {
      local_108 = *in_stack_00000010;
    }
    *in_stack_00000010 = local_108;
    if ((*in_stack_00000010 == lmpar_cvkit::zero) &&
       (!NAN(*in_stack_00000010) && !NAN(lmpar_cvkit::zero))) {
      *in_stack_00000010 = dVar11 / (double)n_00;
    }
    while( true ) {
      qtb_00 = (doublereal *)((long)qtb_00 + 1);
      if ((*in_stack_00000010 == lmpar_cvkit::zero) &&
         (!NAN(*in_stack_00000010) && !NAN(lmpar_cvkit::zero))) {
        in_stack_ffffffffffffffa0 = (doublereal *)(lmpar_cvkit::p001 * local_88);
        local_110 = in_stack_ffffffffffffffa0;
        if ((double)in_stack_ffffffffffffffa0 <= (double)pdVar10) {
          local_110 = pdVar10;
        }
        *in_stack_00000010 = (double)local_110;
        in_stack_ffffffffffffffa8 = pdVar10;
      }
      dVar12 = sqrt(*in_stack_00000010);
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        *(double *)(lVar4 + (long)local_98 * 8) = dVar12 * *(double *)(lVar6 + (long)local_98 * 8);
      }
      qrsolv_cvkit((integer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (integer *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,diag_00,qtb_00,
                   x_00,sdiag_00,wa);
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        *(double *)(in_stack_00000030 + (long)local_98 * 8) =
             *(double *)(lVar6 + (long)local_98 * 8) * *(double *)(lVar5 + (long)local_98 * 8);
      }
      n_00 = (integer *)enorm_cvkit(n_00,in_stack_ffffffffffffff28);
      dVar12 = (double)n_00 - *in_stack_00000008;
      local_118 = dVar12;
      if (dVar12 < 0.0) {
        local_118 = -dVar12;
      }
      if (local_118 <= lmpar_cvkit::p1 * *in_stack_00000008) break;
      if ((((((double)diag_00 == lmpar_cvkit::zero) &&
            (!NAN((double)diag_00) && !NAN(lmpar_cvkit::zero))) && (dVar12 <= local_c8)) &&
          (local_c8 < lmpar_cvkit::zero)) || (qtb_00 == (doublereal *)0xa)) break;
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        lVar2 = *(long *)(lVar7 + (long)local_98 * 8);
        *(double *)(lVar4 + (long)local_98 * 8) =
             *(double *)(lVar6 + lVar2 * 8) *
             (*(double *)(in_stack_00000030 + lVar2 * 8) / (double)n_00);
      }
      lVar9 = *in_RDI;
      for (local_98 = (doublereal *)0x1; (long)local_98 <= lVar9;
          local_98 = (doublereal *)((long)local_98 + 1)) {
        *(double *)(lVar4 + (long)local_98 * 8) =
             *(double *)(lVar4 + (long)local_98 * 8) /
             *(double *)(in_stack_00000020 + -8 + (long)local_98 * 8);
        dVar1 = *(double *)(lVar4 + (long)local_98 * 8);
        local_90 = (long)local_98 + 1;
        if (local_90 <= *in_RDI) {
          in_stack_ffffffffffffffb0 = (doublereal *)*in_RDI;
          for (; local_90 <= (long)in_stack_ffffffffffffffb0; local_90 = local_90 + 1) {
            *(double *)(lVar4 + local_90 * 8) =
                 -*(double *)(lVar8 + (local_90 + (long)local_98 * (long)sdiag_00) * 8) * dVar1 +
                 *(double *)(lVar4 + local_90 * 8);
          }
        }
      }
      dVar11 = enorm_cvkit(n_00,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff98 = (integer *)(((dVar12 / *in_stack_00000008) / dVar11) / dVar11);
      if ((lmpar_cvkit::zero < dVar12) && ((double)diag_00 < *in_stack_00000010)) {
        diag_00 = (doublereal *)*in_stack_00000010;
      }
      if (dVar12 < lmpar_cvkit::zero) {
        if (*in_stack_00000010 < local_88) {
          local_128 = *in_stack_00000010;
        }
        else {
          local_128 = local_88;
        }
        local_88 = local_128;
      }
      in_stack_ffffffffffffffa0 =
           (doublereal *)(*in_stack_00000010 + (double)in_stack_ffffffffffffff98);
      local_130 = in_stack_ffffffffffffffa0;
      if ((double)in_stack_ffffffffffffffa0 <= (double)diag_00) {
        local_130 = diag_00;
      }
      *in_stack_00000010 = (double)local_130;
      local_c8 = dVar12;
      in_stack_ffffffffffffffa8 = diag_00;
    }
  }
  if (qtb_00 == (doublereal *)0x0) {
    *in_stack_00000010 = lmpar_cvkit::zero;
  }
  return 0;
}

Assistant:

int lmpar_cvkit(integer *n, doublereal *r__, integer *ldr,
	integer *ipvt, doublereal *diag, doublereal *qtb, doublereal *delta,
	doublereal *par, doublereal *x, doublereal *sdiag, doublereal *wa1,
	doublereal *wa2)
{
    /* Initialized data */

    static doublereal p1 = .1;
    static doublereal p001 = .001;
    static doublereal zero = 0.;

    /* System generated locals */
    integer r_dim1, r_offset, i__1, i__2;
    doublereal d__1, d__2;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    doublereal parc, parl;
    integer iter;
    doublereal temp, paru;
    integer i__, j, k, l;
    doublereal dwarf;
    integer nsing;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal gnorm, fp;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal dxnorm;
    integer jm1, jp1;
    extern /* Subroutine */ int qrsolv_cvkit(integer *, doublereal *, integer *,
	    integer *, doublereal *, doublereal *, doublereal *, doublereal *,
	     doublereal *);
    doublereal sum;

/*<       integer n,ldr >*/
/*<       integer ipvt(n) >*/
/*<       double precision delta,par >*/
/*<    >*/
/*     ********** */

/*     subroutine lmpar */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, */
/*     the problem is to determine a value for the parameter */
/*     par such that if x solves the system */

/*           a*x = b ,     sqrt(par)*d*x = 0 , */

/*     in the least squares sense, and dxnorm is the euclidean */
/*     norm of d*x, then either par is zero and */

/*           (dxnorm-delta) .le. 0.1*delta , */

/*     or par is positive and */

/*           abs(dxnorm-delta) .le. 0.1*delta . */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization, with column pivoting, of a. that is, if */
/*     a*p = q*r, where p is a permutation matrix, q has orthogonal */
/*     columns, and r is an upper triangular matrix with diagonal */
/*     elements of nonincreasing magnitude, then lmpar expects */
/*     the full upper triangle of r, the permutation matrix p, */
/*     and the first n components of (q transpose)*b. on output */
/*     lmpar also provides an upper triangular matrix s such that */

/*            t   t                   t */
/*           p *(a *a + par*d*d)*p = s *s . */

/*     s is employed within lmpar and may be of separate interest. */

/*     only a few iterations are generally needed for convergence */
/*     of the algorithm. if, however, the limit of 10 iterations */
/*     is reached, then the output par will contain the best */
/*     value obtained so far. */

/*     the subroutine statement is */

/*       subroutine lmpar(n,r,ldr,ipvt,diag,qtb,delta,par,x,sdiag, */
/*                        wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an n by n array. on input the full upper triangle */
/*         must contain the full upper triangle of the matrix r. */
/*         on output the full upper triangle is unaltered, and the */
/*         strict lower triangle contains the strict upper triangle */
/*         (transposed) of the upper triangular matrix s. */

/*       ldr is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array r. */

/*       ipvt is an integer input array of length n which defines the */
/*         permutation matrix p such that a*p = q*r. column j of p */
/*         is column ipvt(j) of the identity matrix. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       par is a nonnegative variable. on input par contains an */
/*         initial estimate of the levenberg-marquardt parameter. */
/*         on output par contains the final estimate. */

/*       x is an output array of length n which contains the least */
/*         squares solution of the system a*x = b, sqrt(par)*d*x = 0, */
/*         for the output par. */

/*       sdiag is an output array of length n which contains the */
/*         diagonal elements of the upper triangular matrix s. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm,qrsolv */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,iter,j,jm1,jp1,k,l,nsing >*/
/*<    >*/
/*<       double precision dpmpar,enorm >*/
/*<       data p1,p001,zero /1.0d-1,1.0d-3,0.0d0/ >*/
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --sdiag;
    --x;
    --qtb;
    --diag;
    --ipvt;
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1 * 1;
    r__ -= r_offset;

    /* Function Body */

/*     dwarf is the smallest positive magnitude. */

/*<       dwarf = dpmpar(2) >*/
    dwarf = dpmpar_cvkit(&c__2);

/*     compute and store in x the gauss-newton direction. if the */
/*     jacobian is rank-deficient, obtain a least squares solution. */

/*<       nsing = n >*/
    nsing = *n;
/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          wa1(j) = qtb(j) >*/
	wa1[j] = qtb[j];
/*<          if (r(j,j) .eq. zero .and. nsing .eq. n) nsing = j - 1 >*/
	if (r__[j + j * r_dim1] == zero && nsing == *n) {
	    nsing = j - 1;
	}
/*<          if (nsing .lt. n) wa1(j) = zero >*/
	if (nsing < *n) {
	    wa1[j] = zero;
	}
/*<    10    continue >*/
/* L10: */
    }
/*<       if (nsing .lt. 1) go to 50 >*/
    if (nsing < 1) {
	goto L50;
    }
/*<       do 40 k = 1, nsing >*/
    i__1 = nsing;
    for (k = 1; k <= i__1; ++k) {
/*<          j = nsing - k + 1 >*/
	j = nsing - k + 1;
/*<          wa1(j) = wa1(j)/r(j,j) >*/
	wa1[j] /= r__[j + j * r_dim1];
/*<          temp = wa1(j) >*/
	temp = wa1[j];
/*<          jm1 = j - 1 >*/
	jm1 = j - 1;
/*<          if (jm1 .lt. 1) go to 30 >*/
	if (jm1 < 1) {
	    goto L30;
	}
/*<          do 20 i = 1, jm1 >*/
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             wa1(i) = wa1(i) - r(i,j)*temp >*/
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/*<    20       continue >*/
/* L20: */
	}
/*<    30    continue >*/
L30:
/*<    40    continue >*/
/* L40: */
	;
    }
/*<    50 continue >*/
L50:
/*<       do 60 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          x(l) = wa1(j) >*/
	x[l] = wa1[j];
/*<    60    continue >*/
/* L60: */
    }

/*     initialize the iteration counter. */
/*     evaluate the function at the origin, and test */
/*     for acceptance of the gauss-newton direction. */

/*<       iter = 0 >*/
    iter = 0;
/*<       do 70 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<    70    continue >*/
/* L70: */
    }
/*<       dxnorm = enorm(n,wa2) >*/
    dxnorm = enorm_cvkit(n, &wa2[1]);
/*<       fp = dxnorm - delta >*/
    fp = dxnorm - *delta;
/*<       if (fp .le. p1*delta) go to 220 >*/
    if (fp <= p1 * *delta) {
	goto L220;
    }

/*     if the jacobian is not rank deficient, the newton */
/*     step provides a lower bound, parl, for the zero of */
/*     the function. otherwise set this bound to zero. */

/*<       parl = zero >*/
    parl = zero;
/*<       if (nsing .lt. n) go to 120 >*/
    if (nsing < *n) {
	goto L120;
    }
/*<       do 80 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          wa1(j) = diag(l)*(wa2(l)/dxnorm) >*/
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/*<    80    continue >*/
/* L80: */
    }
/*<       do 110 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          sum = zero >*/
	sum = zero;
/*<          jm1 = j - 1 >*/
	jm1 = j - 1;
/*<          if (jm1 .lt. 1) go to 100 >*/
	if (jm1 < 1) {
	    goto L100;
	}
/*<          do 90 i = 1, jm1 >*/
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             sum = sum + r(i,j)*wa1(i) >*/
	    sum += r__[i__ + j * r_dim1] * wa1[i__];
/*<    90       continue >*/
/* L90: */
	}
/*<   100    continue >*/
L100:
/*<          wa1(j) = (wa1(j) - sum)/r(j,j) >*/
	wa1[j] = (wa1[j] - sum) / r__[j + j * r_dim1];
/*<   110    continue >*/
/* L110: */
    }
/*<       temp = enorm(n,wa1) >*/
    temp = enorm_cvkit(n, &wa1[1]);
/*<       parl = ((fp/delta)/temp)/temp >*/
    parl = fp / *delta / temp / temp;
/*<   120 continue >*/
L120:

/*     calculate an upper bound, paru, for the zero of the function. */

/*<       do 140 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          sum = zero >*/
	sum = zero;
/*<          do 130 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             sum = sum + r(i,j)*qtb(i) >*/
	    sum += r__[i__ + j * r_dim1] * qtb[i__];
/*<   130       continue >*/
/* L130: */
	}
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          wa1(j) = sum/diag(l) >*/
	wa1[j] = sum / diag[l];
/*<   140    continue >*/
/* L140: */
    }
/*<       gnorm = enorm(n,wa1) >*/
    gnorm = enorm_cvkit(n, &wa1[1]);
/*<       paru = gnorm/delta >*/
    paru = gnorm / *delta;
/*<       if (paru .eq. zero) paru = dwarf/dmin1(delta,p1) >*/
    if (paru == zero) {
	paru = dwarf / min(*delta,p1);
    }

/*     if the input par lies outside of the interval (parl,paru), */
/*     set par to the closer endpoint. */

/*<       par = dmax1(par,parl) >*/
    *par = max(*par,parl);
/*<       par = dmin1(par,paru) >*/
    *par = min(*par,paru);
/*<       if (par .eq. zero) par = gnorm/dxnorm >*/
    if (*par == zero) {
	*par = gnorm / dxnorm;
    }

/*     beginning of an iteration. */

/*<   150 continue >*/
L150:
/*<          iter = iter + 1 >*/
    ++iter;

/*        evaluate the function at the current value of par. */

/*<          if (par .eq. zero) par = dmax1(dwarf,p001*paru) >*/
    if (*par == zero) {
/* Computing MAX */
	d__1 = dwarf, d__2 = p001 * paru;
	*par = max(d__1,d__2);
    }
/*<          temp = dsqrt(par) >*/
    temp = sqrt(*par);
/*<          do 160 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa1(j) = temp*diag(j) >*/
	wa1[j] = temp * diag[j];
/*<   160       continue >*/
/* L160: */
    }
/*<          call qrsolv(n,r,ldr,ipvt,wa1,qtb,x,sdiag,wa2) >*/
    qrsolv_cvkit(n, &r__[r_offset], ldr, &ipvt[1], &wa1[1], &qtb[1], &x[1], &sdiag[
	    1], &wa2[1]);
/*<          do 170 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<   170       continue >*/
/* L170: */
    }
/*<          dxnorm = enorm(n,wa2) >*/
    dxnorm = enorm_cvkit(n, &wa2[1]);
/*<          temp = fp >*/
    temp = fp;
/*<          fp = dxnorm - delta >*/
    fp = dxnorm - *delta;

/*        if the function is small enough, accept the current value */
/*        of par. also test for the exceptional cases where parl */
/*        is zero or the number of iterations has reached 10. */

/*<    >*/
    if (abs(fp) <= p1 * *delta || (parl == zero && fp <= temp && temp < zero) ||
	     iter == 10) {
	goto L220;
    }

/*        compute the newton correction. */

/*<          do 180 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             l = ipvt(j) >*/
	l = ipvt[j];
/*<             wa1(j) = diag(l)*(wa2(l)/dxnorm) >*/
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/*<   180       continue >*/
/* L180: */
    }
/*<          do 210 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa1(j) = wa1(j)/sdiag(j) >*/
	wa1[j] /= sdiag[j];
/*<             temp = wa1(j) >*/
	temp = wa1[j];
/*<             jp1 = j + 1 >*/
	jp1 = j + 1;
/*<             if (n .lt. jp1) go to 200 >*/
	if (*n < jp1) {
	    goto L200;
	}
/*<             do 190 i = jp1, n >*/
	i__2 = *n;
	for (i__ = jp1; i__ <= i__2; ++i__) {
/*<                wa1(i) = wa1(i) - r(i,j)*temp >*/
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/*<   190          continue >*/
/* L190: */
	}
/*<   200       continue >*/
L200:
/*<   210       continue >*/
/* L210: */
	;
    }
/*<          temp = enorm(n,wa1) >*/
    temp = enorm_cvkit(n, &wa1[1]);
/*<          parc = ((fp/delta)/temp)/temp >*/
    parc = fp / *delta / temp / temp;

/*        depending on the sign of the function, update parl or paru. */

/*<          if (fp .gt. zero) parl = dmax1(parl,par) >*/
    if (fp > zero) {
	parl = max(parl,*par);
    }
/*<          if (fp .lt. zero) paru = dmin1(paru,par) >*/
    if (fp < zero) {
	paru = min(paru,*par);
    }

/*        compute an improved estimate for par. */

/*<          par = dmax1(parl,par+parc) >*/
/* Computing MAX */
    d__1 = parl, d__2 = *par + parc;
    *par = max(d__1,d__2);

/*        end of an iteration. */

/*<          go to 150 >*/
    goto L150;
/*<   220 continue >*/
L220:

/*     termination. */

/*<       if (iter .eq. 0) par = zero >*/
    if (iter == 0) {
	*par = zero;
    }
/*<       return >*/
    return 0;

/*     last card of subroutine lmpar. */

/*<       end >*/
}